

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamZ.cpp
# Opt level: O2

void __thiscall OpenMD::TetrahedralityParamZ::process(TetrahedralityParamZ *this)

{
  SelectionManager *this_00;
  SelectionManager *this_01;
  int *piVar1;
  char cVar2;
  SimInfo *info;
  Snapshot *this_02;
  pointer pdVar3;
  uint uVar4;
  int iVar5;
  StuntDouble *this_03;
  StuntDouble *this_04;
  int whichFrame;
  long lVar6;
  ulong uVar7;
  pointer pOVar8;
  double dVar9;
  double local_1440;
  vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  myNeighbors;
  SelectionSet local_1410;
  int local_13f4;
  int local_13f0;
  int local_13ec;
  int isd2;
  int isd1;
  ulong local_13e0;
  long local_13d8;
  SelectionEvaluator *local_13d0;
  SelectionEvaluator *local_13c8;
  vector<double,_std::allocator<double>_> *local_13c0;
  double local_13b8;
  ulong local_13b0;
  ulong local_13a8;
  double local_13a0;
  ulong local_1398;
  Vector3d rk;
  Vector3d rik;
  Vector3d vec;
  Vector3d ri;
  Vector<double,_3U> local_1330;
  Vector<double,_3U> local_1318;
  Vector3d rkj;
  Vector3d rj;
  Mat3x3d hmat;
  DumpReader reader;
  
  Vector<double,_3U>::Vector(&vec.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&ri.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rj.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rk.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rik.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rkj.super_Vector<double,_3U>);
  myNeighbors.
  super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  myNeighbors.
  super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  myNeighbors.
  super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  info = (this->super_StaticAnalyser).info_;
  cVar2 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&reader,info,&(this->super_StaticAnalyser).dumpFilename_);
  local_13f4 = DumpReader::getNFrames(&reader);
  local_13c0 = &this->zBox_;
  local_13c8 = &this->evaluator1_;
  this_00 = &this->seleMan1_;
  local_13d0 = &this->evaluator2_;
  this_01 = &this->seleMan2_;
  for (whichFrame = 0; whichFrame < local_13f4;
      whichFrame = whichFrame + (this->super_StaticAnalyser).step_) {
    DumpReader::readFrame(&reader,whichFrame);
    this_02 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    this->currentSnapshot_ = this_02;
    Snapshot::getHmat(&hmat,this_02);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_13c0,
               (value_type_conflict2 *)
               ((long)hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
               (ulong)(uint)this->axis_ * 0x20));
    local_13b8 = *(double *)
                  ((long)hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                  (ulong)(uint)this->axis_ * 0x20) * 0.5;
    if ((this->evaluator1_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_1410,local_13c8);
      SelectionManager::setSelectionSet(this_00,&local_1410);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_1410.bitsets_);
    }
    if ((this->evaluator2_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_1410,local_13d0);
      SelectionManager::setSelectionSet(this_01,&local_1410);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_1410.bitsets_);
    }
    this_03 = SelectionManager::beginSelected(this_00,&isd1);
    local_13ec = whichFrame;
    while (this_03 != (StuntDouble *)0x0) {
      if (myNeighbors.
          super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          myNeighbors.
          super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        myNeighbors.
        super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             myNeighbors.
             super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      iVar5 = this_03->globalIndex_;
      this_04 = SelectionManager::beginSelected(this_01,&isd2);
      while (this_04 != (StuntDouble *)0x0) {
        if (this_04->globalIndex_ != iVar5) {
          StuntDouble::getPos((Vector3d *)&local_1318,this_03);
          StuntDouble::getPos((Vector3d *)&local_1330,this_04);
          operator-((Vector<double,_3U> *)&local_1410,&local_1318,&local_1330);
          Vector3<double>::operator=(&vec,(Vector<double,_3U> *)&local_1410);
          if (cVar2 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,&vec);
          }
          pOVar8 = (pointer)Vector<double,_3U>::length(&vec.super_Vector<double,_3U>);
          if ((double)pOVar8 < this->rCut_) {
            local_1410.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = pOVar8;
            local_1410.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)this_04;
            std::
            vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>
            ::emplace_back<std::pair<double,OpenMD::StuntDouble*>>
                      ((vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>
                        *)&myNeighbors,(pair<double,_OpenMD::StuntDouble_*> *)&local_1410);
          }
        }
        this_04 = SelectionManager::nextSelected(this_01,&isd2);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<std::pair<double,OpenMD::StuntDouble*>*,std::vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (myNeighbors.
                 super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 myNeighbors.
                 super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      local_1398 = (long)myNeighbors.
                         super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)myNeighbors.
                         super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (3 < local_1398) {
        local_1398 = 4;
      }
      iVar5 = (int)local_1398;
      uVar4 = iVar5 - 1;
      StuntDouble::getPos((Vector3d *)&local_1410,this_03);
      Vector<double,_3U>::operator=(&rk.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_1410);
      local_13f0 = (int)((double)(int)(uVar4 * iVar5) * 0.5);
      local_13a0 = (double)local_13f0;
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      local_13b0 = (ulong)uVar4;
      local_13d8 = 0x18;
      local_13e0 = 1;
      local_1440 = 1.0;
      uVar7 = 0;
      while (uVar7 != local_13b0) {
        StuntDouble::getPos((Vector3d *)&local_1410,
                            myNeighbors.
                            super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7].second);
        Vector<double,_3U>::operator=
                  (&ri.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_1410);
        operator-((Vector<double,_3U> *)&local_1410,&rk.super_Vector<double,_3U>,
                  &ri.super_Vector<double,_3U>);
        Vector3<double>::operator=(&rik,(Vector<double,_3U> *)&local_1410);
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,&rik);
        }
        Vector<double,_3U>::normalize(&rik.super_Vector<double,_3U>);
        local_13a8 = uVar7 + 1;
        lVar6 = local_13d8;
        for (uVar7 = local_13e0; uVar7 < local_1398; uVar7 = uVar7 + 1) {
          StuntDouble::getPos((Vector3d *)&local_1410,
                              *(StuntDouble **)
                               ((long)&(myNeighbors.
                                        super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar6));
          Vector<double,_3U>::operator=
                    (&rj.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_1410);
          operator-((Vector<double,_3U> *)&local_1410,&rk.super_Vector<double,_3U>,
                    &rj.super_Vector<double,_3U>);
          Vector3<double>::operator=
                    ((Vector3<double> *)&rkj.super_Vector<double,_3U>,
                     (Vector<double,_3U> *)&local_1410);
          if (cVar2 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&rkj.super_Vector<double,_3U>);
          }
          Vector<double,_3U>::normalize(&rkj.super_Vector<double,_3U>);
          dVar9 = dot<double,3u>(&rik.super_Vector<double,_3U>,&rkj.super_Vector<double,_3U>);
          local_1440 = local_1440 +
                       ((dVar9 + 0.3333333333333333) * (dVar9 + 0.3333333333333333) * -2.25) /
                       local_13a0;
          lVar6 = lVar6 + 0x10;
        }
        local_13e0 = local_13e0 + 1;
        local_13d8 = local_13d8 + 0x10;
        uVar7 = local_13a8;
        whichFrame = local_13ec;
      }
      if (0 < local_13f0) {
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,&rk);
        }
        iVar5 = (int)(((rk.super_Vector<double,_3U>.data_[(uint)this->axis_] + local_13b8) *
                      (double)(this->super_StaticAnalyser).nBins_) /
                     *(double *)
                      ((long)hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                             data_ + (ulong)(uint)this->axis_ * 0x20));
        pdVar3 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3[iVar5] = pdVar3[iVar5] + local_1440;
        pdVar3 = (this->sliceQ2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3[iVar5] = local_1440 * local_1440 + pdVar3[iVar5];
        piVar1 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar5;
        *piVar1 = *piVar1 + 1;
      }
      this_03 = SelectionManager::nextSelected(this_00,&isd1);
    }
  }
  writeQz(this);
  DumpReader::~DumpReader(&reader);
  std::
  _Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  ::~_Vector_base(&myNeighbors.
                   super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                 );
  return;
}

Assistant:

void TetrahedralityParamZ::process() {
    StuntDouble* sd;
    StuntDouble* sd2;
    StuntDouble* sdi;
    StuntDouble* sdj;
    int myIndex;
    Vector3d vec;
    Vector3d ri, rj, rk, rik, rkj;
    RealType r;
    RealType cospsi;
    RealType Qk;
    std::vector<std::pair<RealType, StuntDouble*>> myNeighbors;
    int isd1;
    int isd2;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Mat3x3d hmat = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      // outer loop is over the selected StuntDoubles:
      for (sd = seleMan1_.beginSelected(isd1); sd != NULL;
           sd = seleMan1_.nextSelected(isd1)) {
        myIndex = sd->getGlobalIndex();

        Qk = 1.0;
        myNeighbors.clear();

        for (sd2 = seleMan2_.beginSelected(isd2); sd2 != NULL;
             sd2 = seleMan2_.nextSelected(isd2)) {
          if (sd2->getGlobalIndex() != myIndex) {
            vec = sd->getPos() - sd2->getPos();

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            r = vec.length();

            // Check to see if neighbor is in bond cutoff

            if (r < rCut_) { myNeighbors.push_back(std::make_pair(r, sd2)); }
          }
        }

        // Sort the vector using predicate and std::sort
        std::sort(myNeighbors.begin(), myNeighbors.end());

        // Use only the 4 closest neighbors to do the rest of the work:

        int nbors = myNeighbors.size() > 4 ? 4 : myNeighbors.size();
        int nang  = int(0.5 * (nbors * (nbors - 1)));

        rk = sd->getPos();

        for (int i = 0; i < nbors - 1; i++) {
          sdi = myNeighbors[i].second;
          ri  = sdi->getPos();
          rik = rk - ri;
          if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(rik);

          rik.normalize();

          for (int j = i + 1; j < nbors; j++) {
            sdj = myNeighbors[j].second;
            rj  = sdj->getPos();
            rkj = rk - rj;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rkj);
            rkj.normalize();

            cospsi = dot(rik, rkj);

            // Calculates scaled Qk for each molecule using calculated
            // angles from 4 or fewer nearest neighbors.
            Qk -= (pow(cospsi + 1.0 / 3.0, 2) * 2.25 / nang);
          }
        }

        if (nang > 0) {
          if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(rk);

          int binNo =
              int(nBins_ * (halfBoxZ_ + rk[axis_]) / hmat(axis_, axis_));
          sliceQ_[binNo] += Qk;
          sliceQ2_[binNo] += Qk * Qk;
          sliceCount_[binNo] += 1;
        }
      }
    }
    writeQz();
  }